

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_node_metric(REF_NODE ref_node,FILE *file)

{
  REF_MPI ref_mpi;
  FILE *__stream;
  uint uVar1;
  uint uVar2;
  REF_STATUS RVar3;
  void *__s;
  void *output;
  ulong uVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  REF_STATUS ref_private_macro_code_rxs;
  char *pcVar10;
  ulong uVar11;
  double dVar12;
  REF_INT local;
  uint local_7c;
  int local_5c;
  long local_58;
  size_t local_50;
  ulong local_48;
  ulong local_40;
  FILE *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  uVar1 = (int)(ref_node->old_n_global / (long)ref_mpi->n) + 1;
  uVar2 = 0x7fffffff;
  if (0 < ref_mpi->reduce_byte_limit) {
    uVar2 = (uint)ref_mpi->reduce_byte_limit / 0x38;
  }
  if ((int)uVar1 < (int)uVar2) {
    uVar2 = uVar1;
  }
  if ((int)uVar2 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x509,
           "ref_gather_node_metric","malloc local_xyzm of REF_DBL negative");
    RVar3 = 1;
  }
  else {
    uVar1 = uVar2 * 7;
    local_38 = (FILE *)file;
    __s = malloc((ulong)uVar1 << 3);
    if (__s == (void *)0x0) {
      pcVar10 = "malloc local_xyzm of REF_DBL NULL";
      uVar6 = 0x509;
    }
    else {
      output = malloc((ulong)uVar1 << 3);
      if (output != (void *)0x0) {
        lVar9 = ref_node->old_n_global;
        if (0 < lVar9) {
          uVar4 = 1;
          if (1 < (int)uVar1) {
            uVar4 = (ulong)uVar1;
          }
          local_50 = uVar4 << 3;
          lVar8 = 0;
          local_48 = (ulong)uVar2;
          local_40 = (ulong)uVar2;
          do {
            uVar4 = lVar9 - lVar8;
            if ((long)local_40 < lVar9 - lVar8) {
              uVar4 = local_48;
            }
            if ((int)local_48 != 0) {
              memset(__s,0,local_50);
            }
            iVar7 = (int)uVar4;
            local_58 = lVar8;
            if (0 < iVar7) {
              uVar11 = 0;
              do {
                uVar2 = ref_node_local(ref_node,lVar8,&local_5c);
                if ((uVar2 != 0) && (uVar2 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x519,"ref_gather_node_metric",(ulong)uVar2,"node local failed");
                  local_7c = uVar2;
                }
                if (uVar2 == 5) {
LAB_0012de31:
                  puVar5 = (undefined8 *)((uVar11 & 0x7fffffff8) + (long)__s);
                  puVar5[4] = 0;
                  puVar5[5] = 0;
                  puVar5[2] = 0;
                  puVar5[3] = 0;
                  *puVar5 = 0;
                  puVar5[1] = 0;
                  puVar5[6] = 0;
                }
                else {
                  if (uVar2 != 0) {
                    return local_7c;
                  }
                  if (ref_mpi->id != ref_node->part[local_5c]) goto LAB_0012de31;
                  uVar2 = ref_node_metric_get(ref_node,local_5c,(REF_DBL *)((long)__s + uVar11));
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x51c,"ref_gather_node_metric",(ulong)uVar2,"get");
                    return uVar2;
                  }
                  *(undefined8 *)((long)__s + uVar11 + 0x30) = 0x3ff0000000000000;
                }
                uVar11 = uVar11 + 0x38;
                lVar8 = lVar8 + 1;
              } while ((uVar4 & 0xffffffff) * 0x38 - uVar11 != 0);
            }
            uVar2 = ref_mpi_sum(ref_mpi,__s,output,iVar7 * 7,3);
            __stream = local_38;
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x523,"ref_gather_node_metric",(ulong)uVar2,"sum");
              return uVar2;
            }
            if ((ref_mpi->id == 0) && (0 < iVar7)) {
              lVar8 = 0;
              lVar9 = local_58;
              do {
                dVar12 = *(double *)((long)output + lVar8 + 0x30) + -1.0;
                if (dVar12 <= -dVar12) {
                  dVar12 = -dVar12;
                }
                if (0.1 < dVar12) {
                  printf("error gather node %ld %f\n",lVar9);
                }
                fprintf(__stream,"%.15e %.15e %.15e %.15e %.15e %.15e \n",
                        (int)*(undefined8 *)((long)output + lVar8),
                        *(undefined8 *)((long)output + lVar8 + 8),
                        *(undefined8 *)((long)output + lVar8 + 0x10),
                        *(undefined8 *)((long)output + lVar8 + 0x18),
                        *(undefined8 *)((long)output + lVar8 + 0x20),
                        *(undefined8 *)((long)output + lVar8 + 0x28));
                lVar8 = lVar8 + 0x38;
                lVar9 = lVar9 + 1;
              } while ((uVar4 & 0xffffffff) * 0x38 - lVar8 != 0);
            }
            lVar8 = local_58 + iVar7;
            lVar9 = ref_node->old_n_global;
          } while (lVar8 < lVar9);
        }
        free(output);
        free(__s);
        return 0;
      }
      pcVar10 = "malloc xyzm of REF_DBL NULL";
      uVar6 = 0x50a;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar6,
           "ref_gather_node_metric",pcVar10);
    RVar3 = 2;
  }
  return RVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_metric(REF_NODE ref_node,
                                                 FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im;
  REF_STATUS status;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(
      chunk, ref_mpi_reduce_chunk_limit(ref_mpi, 7 * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, 7 * chunk, REF_DBL);
  ref_malloc(xyzm, 7 * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < 7 * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        RSS(ref_node_metric_get(ref_node, local, &(local_xyzm[7 * i])), "get");
        local_xyzm[6 + 7 * i] = 1.0;
      } else {
        for (im = 0; im < 7; im++) local_xyzm[im + 7 * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, 7 * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[6 + 7 * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[6 + 7 * i]);
        }
        fprintf(file, "%.15e %.15e %.15e %.15e %.15e %.15e \n", xyzm[0 + 7 * i],
                xyzm[1 + 7 * i], xyzm[2 + 7 * i], xyzm[3 + 7 * i],
                xyzm[4 + 7 * i], xyzm[5 + 7 * i]);
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  return REF_SUCCESS;
}